

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

matd_t * matd_crossproduct(matd_t *a,matd_t *b)

{
  matd_t mVar1;
  matd_t mVar2;
  matd_t mVar3;
  matd_t mVar4;
  matd_t mVar5;
  matd_t mVar6;
  int iVar7;
  matd_t *pmVar8;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x3a9,"matd_t *matd_crossproduct(const matd_t *, const matd_t *)");
  }
  if (b != (matd_t *)0x0) {
    pmVar8 = b;
    iVar7 = matd_is_vector_len(a,(int)b);
    if (iVar7 != 0) {
      iVar7 = matd_is_vector_len(b,(int)pmVar8);
      if (iVar7 != 0) {
        pmVar8 = matd_create(a->nrows,a->ncols);
        mVar1 = b[1];
        mVar2 = a[1];
        mVar3 = a[2];
        mVar4 = a[3];
        mVar5 = b[2];
        mVar6 = b[3];
        pmVar8[1] = (matd_t)((double)mVar6 * (double)mVar3 - (double)mVar4 * (double)mVar5);
        pmVar8[2] = (matd_t)((double)mVar1 * (double)mVar4 - (double)mVar2 * (double)mVar6);
        pmVar8[3] = (matd_t)((double)mVar2 * (double)mVar5 - (double)mVar1 * (double)mVar3);
        return pmVar8;
      }
    }
    __assert_fail("matd_is_vector_len(a, 3) && matd_is_vector_len(b, 3)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x3ab,"matd_t *matd_crossproduct(const matd_t *, const matd_t *)");
  }
  __assert_fail("b != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x3aa,"matd_t *matd_crossproduct(const matd_t *, const matd_t *)");
}

Assistant:

matd_t *matd_crossproduct(const matd_t *a, const matd_t *b)
{ // only defined for vecs (col or row) of length 3
    assert(a != NULL);
    assert(b != NULL);
    assert(matd_is_vector_len(a, 3) && matd_is_vector_len(b, 3));

    matd_t * r = matd_create(a->nrows, a->ncols);

    r->data[0] = a->data[1] * b->data[2] - a->data[2] * b->data[1];
    r->data[1] = a->data[2] * b->data[0] - a->data[0] * b->data[2];
    r->data[2] = a->data[0] * b->data[1] - a->data[1] * b->data[0];

    return r;
}